

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDMMCSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SDMMCSimulationDataGenerator::CreateResponse48
          (SDMMCSimulationDataGenerator *this,uint index,unsigned_long arg)

{
  SimulationChannelDescriptor *pSVar1;
  int iVar2;
  ulong uVar3;
  BitExtractor bits;
  U64 data;
  BitExtractor local_30 [8];
  ulong local_28;
  
  uVar3 = (ulong)index << 0x20 | arg;
  local_28 = uVar3;
  iVar2 = SimulationChannelDescriptor::GetCurrentBitState();
  if (iVar2 != 1) {
    SimulationChannelDescriptor::Transition();
    ClockGenerator::AdvanceByHalfPeriod(0.5);
    SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x18);
  }
  CreateClockPeriod(this);
  CreateClockPeriod(this);
  iVar2 = 0x28;
  BitExtractor::BitExtractor(local_30,uVar3,MsbFirst,0x28);
  do {
    pSVar1 = this->mCommand;
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)pSVar1);
    CreateClockPeriod(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  SDMMCHelpers::crc7((U8 *)&local_28,5);
  iVar2 = 7;
  do {
    SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
    CreateClockPeriod(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mCommand);
  CreateClockPeriod(this);
  BitExtractor::~BitExtractor(local_30);
  return;
}

Assistant:

void SDMMCSimulationDataGenerator::CreateResponse48(unsigned int index, unsigned long arg)
{
	U64 data =
		(0ull       << 39) | /* start bit */
		(0ull       << 38) | /* transmission bit: host */
		((U64)index << 32) | /* command index */
		((U64)arg   <<  0);  /* command argument */

	/* make sure we continue with clock as high */
	if (mClock->GetCurrentBitState() != BIT_HIGH) {
		mClock->Transition();
		mChannels.AdvanceAll(mClockGenerator.AdvanceByHalfPeriod(.5));
	}

	CreateClockPeriod();
	CreateClockPeriod();

	BitExtractor bits(data, AnalyzerEnums::MsbFirst, 40);

	for (int i = 0; i < 40; i++) {
		mCommand->TransitionIfNeeded(bits.GetNextBit());
		CreateClockPeriod();
	}

	/* FIXME: ugly, only works on little-endian */
	U8 crc = SDMMCHelpers::crc7((U8 *)&data, 5);

	for (int i = 0; i < 7; i++) {
		crc <<= 1;

		mCommand->TransitionIfNeeded(crc & 0x80 ? BIT_HIGH : BIT_LOW);
		CreateClockPeriod();
	}

	/* stop bit */
	mCommand->TransitionIfNeeded(BIT_HIGH);
	CreateClockPeriod();
}